

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

Response * __thiscall
slack::_detail::Session::makeRequest(Response *__return_storage_ptr__,Session *this)

{
  CURL *pCVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  char *pcVar4;
  runtime_error *this_00;
  ostream *poVar5;
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [8];
  string error_msg;
  bool local_a9;
  string local_a8 [7];
  bool is_error;
  string header_string;
  string local_88 [8];
  string response_string;
  allocator local_61;
  string local_60 [48];
  undefined1 local_30 [8];
  curl_header header;
  lock_guard<std::mutex> lock;
  Session *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&header.element,&this->mutex_request_);
  curl_header::curl_header((curl_header *)local_30,this->curl_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Content-Type: application/x-www-form-urlencoded",&local_61)
  ;
  curl_header::append((curl_header *)local_30,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pCVar1 = this->curl_;
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(pCVar1,0x2712,uVar3);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  curl_easy_setopt(this->curl_,0x4e2b,writeFunction);
  curl_easy_setopt(this->curl_,0x2711,local_88);
  curl_easy_setopt(this->curl_,0x272d,local_a8);
  CVar2 = curl_easy_perform(this->curl_);
  this->res_ = CVar2;
  local_a9 = false;
  std::__cxx11::string::string(local_d0);
  if (this->res_ != CURLE_OK) {
    local_a9 = true;
    pcVar4 = (char *)curl_easy_strerror(this->res_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar4,&local_111);
    std::operator+((char *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17b0b5);
    std::__cxx11::string::operator=(local_d0,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    if ((this->throw_exception_ & 1U) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,local_d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"[slacking] curl_easy_perform() failed ");
    poVar5 = std::operator<<(poVar5,local_d0);
    std::operator<<(poVar5,'\n');
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_88);
  __return_storage_ptr__->is_error = local_a9;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->error_message,local_d0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  curl_header::~curl_header((curl_header *)local_30);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&header.element);
  return __return_storage_ptr__;
}

Assistant:

inline
Response Session::makeRequest() {
    std::lock_guard<std::mutex> lock(mutex_request_);
    
    //------ set our custom set of headers
    // for  using incoming webhook it is mandatory to set 
    // "Content-Type: application/x-www-form-urlencoded" in header

    curl_header  header(curl_);
    header.append("Content-Type: application/x-www-form-urlencoded");
    
    //-------- set our custom set of headers------------------------------  

    curl_easy_setopt(curl_, CURLOPT_URL, url_.c_str());
    
    std::string response_string;
    std::string header_string;
    curl_easy_setopt(curl_, CURLOPT_WRITEFUNCTION, writeFunction);
    curl_easy_setopt(curl_, CURLOPT_WRITEDATA, &response_string);
    curl_easy_setopt(curl_, CURLOPT_HEADERDATA, &header_string);

    res_ = curl_easy_perform(curl_);

    bool is_error = false;
    std::string error_msg{};
    if(res_ != CURLE_OK) {
        is_error = true;
        error_msg = "curl_easy_perform() failed " + std::string{curl_easy_strerror(res_)};
        if (throw_exception_) 
            throw std::runtime_error(error_msg);
        else 
            std::cerr << "[slacking] curl_easy_perform() failed " << error_msg << '\n';
    }

    return { response_string, is_error, error_msg };
}